

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-bind-error.c
# Opt level: O3

int run_test_tcp_bind_error_fault(void)

{
  int iVar1;
  int extraout_EAX;
  uv_loop_t *puVar2;
  uv_loop_t *unaff_RBX;
  uv_handle_t *handle;
  int64_t eval_b;
  int64_t eval_a;
  char garbage [60];
  uv_tcp_t server;
  undefined1 auStack_888 [12];
  undefined8 uStack_87c;
  undefined4 uStack_874;
  uv_tcp_t uStack_870;
  uv_loop_t *puStack_798;
  long lStack_788;
  long lStack_780;
  uv_shutdown_t uStack_778;
  sockaddr_in sStack_720;
  uv_write_t uStack_710;
  uv_buf_t uStack_648;
  uv_tcp_t uStack_638;
  uv_loop_t *puStack_560;
  long lStack_550;
  long lStack_548;
  uv_tcp_t uStack_540;
  uv_loop_t *puStack_468;
  long lStack_458;
  long lStack_450;
  sockaddr_in sStack_448;
  uv_tcp_t uStack_438;
  uv_loop_t *puStack_360;
  long lStack_350;
  long lStack_348;
  sockaddr_in sStack_340;
  uv_tcp_t uStack_330;
  uv_loop_t *puStack_258;
  long lStack_248;
  long lStack_240;
  sockaddr_in sStack_238;
  sockaddr_in sStack_228;
  uv_tcp_t uStack_218;
  uv_loop_t *puStack_140;
  long local_138;
  long local_130;
  sockaddr local_128;
  char local_118 [56];
  uv_tcp_t local_e0;
  
  builtin_strncpy(local_118 + 0x20,"h blah blah",0xc);
  builtin_strncpy(local_118 + 0x10,"ah blah blah bla",0x10);
  builtin_strncpy(local_118,"lah blah blah bl",0x10);
  local_128._0_8_ = 0x616c622068616c62;
  builtin_strncpy(local_128.sa_data + 6,"h blah b",8);
  puStack_140 = (uv_loop_t *)0x1c315d;
  puVar2 = uv_default_loop();
  puStack_140 = (uv_loop_t *)0x1c316a;
  iVar1 = uv_tcp_init(puVar2,&local_e0);
  local_130 = (long)iVar1;
  local_138 = 0;
  if (local_130 == 0) {
    puStack_140 = (uv_loop_t *)0x1c3199;
    iVar1 = uv_tcp_bind(&local_e0,&local_128,0);
    local_130 = (long)iVar1;
    local_138 = -0x16;
    if (local_130 != -0x16) goto LAB_001c325d;
    puStack_140 = (uv_loop_t *)0x1c31c8;
    uv_close((uv_handle_t *)&local_e0,close_cb);
    puStack_140 = (uv_loop_t *)0x1c31cd;
    puVar2 = uv_default_loop();
    puStack_140 = (uv_loop_t *)0x1c31d7;
    uv_run(puVar2,UV_RUN_DEFAULT);
    local_130 = 1;
    local_138 = (long)close_cb_called;
    if (local_138 != 1) goto LAB_001c326a;
    puStack_140 = (uv_loop_t *)0x1c31fb;
    unaff_RBX = uv_default_loop();
    puStack_140 = (uv_loop_t *)0x1c320f;
    uv_walk(unaff_RBX,close_walk_cb,(void *)0x0);
    puStack_140 = (uv_loop_t *)0x1c3219;
    uv_run(unaff_RBX,UV_RUN_DEFAULT);
    local_130 = 0;
    puStack_140 = (uv_loop_t *)0x1c3227;
    puVar2 = uv_default_loop();
    puStack_140 = (uv_loop_t *)0x1c322f;
    iVar1 = uv_loop_close(puVar2);
    local_138 = (long)iVar1;
    if (local_130 == local_138) {
      puStack_140 = (uv_loop_t *)0x1c3245;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    puStack_140 = (uv_loop_t *)0x1c325d;
    run_test_tcp_bind_error_fault_cold_1();
LAB_001c325d:
    puStack_140 = (uv_loop_t *)0x1c326a;
    run_test_tcp_bind_error_fault_cold_2();
LAB_001c326a:
    puStack_140 = (uv_loop_t *)0x1c3277;
    run_test_tcp_bind_error_fault_cold_3();
  }
  puStack_140 = (uv_loop_t *)run_test_tcp_bind_error_inval;
  run_test_tcp_bind_error_fault_cold_4();
  puStack_258 = (uv_loop_t *)0x1c32a2;
  puStack_140 = unaff_RBX;
  iVar1 = uv_ip4_addr("0.0.0.0",0x23a3,&sStack_228);
  uStack_218.data = (void *)(long)iVar1;
  sStack_238.sin_family = 0;
  sStack_238.sin_port = 0;
  sStack_238.sin_addr.s_addr = 0;
  if (uStack_218.data == (void *)0x0) {
    puStack_258 = (uv_loop_t *)0x1c32d8;
    iVar1 = uv_ip4_addr("0.0.0.0",0x23a4,&sStack_238);
    uStack_218.data = (void *)(long)iVar1;
    lStack_248 = 0;
    if (uStack_218.data != (void *)0x0) goto LAB_001c343c;
    puStack_258 = (uv_loop_t *)0x1c32fd;
    puVar2 = uv_default_loop();
    puStack_258 = (uv_loop_t *)0x1c330a;
    iVar1 = uv_tcp_init(puVar2,&uStack_218);
    lStack_248 = (long)iVar1;
    lStack_240 = 0;
    if (lStack_248 != 0) goto LAB_001c344b;
    puStack_258 = (uv_loop_t *)0x1c333b;
    iVar1 = uv_tcp_bind(&uStack_218,(sockaddr *)&sStack_228,0);
    lStack_248 = (long)iVar1;
    lStack_240 = 0;
    if (lStack_248 != 0) goto LAB_001c345a;
    puStack_258 = (uv_loop_t *)0x1c336c;
    iVar1 = uv_tcp_bind(&uStack_218,(sockaddr *)&sStack_238,0);
    lStack_248 = (long)iVar1;
    lStack_240 = -0x16;
    if (lStack_248 != -0x16) goto LAB_001c3469;
    puStack_258 = (uv_loop_t *)0x1c339d;
    uv_close((uv_handle_t *)&uStack_218,close_cb);
    puStack_258 = (uv_loop_t *)0x1c33a2;
    puVar2 = uv_default_loop();
    puStack_258 = (uv_loop_t *)0x1c33ac;
    uv_run(puVar2,UV_RUN_DEFAULT);
    lStack_248 = 1;
    lStack_240 = (long)close_cb_called;
    if (lStack_240 != 1) goto LAB_001c3478;
    puStack_258 = (uv_loop_t *)0x1c33d6;
    unaff_RBX = uv_default_loop();
    puStack_258 = (uv_loop_t *)0x1c33ea;
    uv_walk(unaff_RBX,close_walk_cb,(void *)0x0);
    puStack_258 = (uv_loop_t *)0x1c33f4;
    uv_run(unaff_RBX,UV_RUN_DEFAULT);
    lStack_248 = 0;
    puStack_258 = (uv_loop_t *)0x1c3402;
    puVar2 = uv_default_loop();
    puStack_258 = (uv_loop_t *)0x1c340a;
    iVar1 = uv_loop_close(puVar2);
    lStack_240 = (long)iVar1;
    if (lStack_248 == lStack_240) {
      puStack_258 = (uv_loop_t *)0x1c3422;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    puStack_258 = (uv_loop_t *)0x1c343c;
    run_test_tcp_bind_error_inval_cold_1();
LAB_001c343c:
    puStack_258 = (uv_loop_t *)0x1c344b;
    run_test_tcp_bind_error_inval_cold_2();
LAB_001c344b:
    puStack_258 = (uv_loop_t *)0x1c345a;
    run_test_tcp_bind_error_inval_cold_3();
LAB_001c345a:
    puStack_258 = (uv_loop_t *)0x1c3469;
    run_test_tcp_bind_error_inval_cold_4();
LAB_001c3469:
    puStack_258 = (uv_loop_t *)0x1c3478;
    run_test_tcp_bind_error_inval_cold_5();
LAB_001c3478:
    puStack_258 = (uv_loop_t *)0x1c3487;
    run_test_tcp_bind_error_inval_cold_6();
  }
  puStack_258 = (uv_loop_t *)run_test_tcp_bind_localhost_ok;
  run_test_tcp_bind_error_inval_cold_7();
  puStack_360 = (uv_loop_t *)0x1c34b4;
  puStack_258 = unaff_RBX;
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&sStack_340);
  uStack_330.data = (void *)(long)iVar1;
  lStack_350 = 0;
  if (uStack_330.data == (void *)0x0) {
    puStack_360 = (uv_loop_t *)0x1c34d9;
    puVar2 = uv_default_loop();
    puStack_360 = (uv_loop_t *)0x1c34e6;
    iVar1 = uv_tcp_init(puVar2,&uStack_330);
    lStack_350 = (long)iVar1;
    lStack_348 = 0;
    if (lStack_350 != 0) goto LAB_001c359e;
    puStack_360 = (uv_loop_t *)0x1c3517;
    iVar1 = uv_tcp_bind(&uStack_330,(sockaddr *)&sStack_340,0);
    lStack_350 = (long)iVar1;
    lStack_348 = 0;
    if (lStack_350 != 0) goto LAB_001c35ad;
    puStack_360 = (uv_loop_t *)0x1c3538;
    unaff_RBX = uv_default_loop();
    puStack_360 = (uv_loop_t *)0x1c354c;
    uv_walk(unaff_RBX,close_walk_cb,(void *)0x0);
    puStack_360 = (uv_loop_t *)0x1c3556;
    uv_run(unaff_RBX,UV_RUN_DEFAULT);
    lStack_350 = 0;
    puStack_360 = (uv_loop_t *)0x1c3564;
    puVar2 = uv_default_loop();
    puStack_360 = (uv_loop_t *)0x1c356c;
    iVar1 = uv_loop_close(puVar2);
    lStack_348 = (long)iVar1;
    if (lStack_350 == lStack_348) {
      puStack_360 = (uv_loop_t *)0x1c3584;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    puStack_360 = (uv_loop_t *)0x1c359e;
    run_test_tcp_bind_localhost_ok_cold_1();
LAB_001c359e:
    puStack_360 = (uv_loop_t *)0x1c35ad;
    run_test_tcp_bind_localhost_ok_cold_2();
LAB_001c35ad:
    puStack_360 = (uv_loop_t *)0x1c35bc;
    run_test_tcp_bind_localhost_ok_cold_3();
  }
  puStack_360 = (uv_loop_t *)run_test_tcp_bind_invalid_flags;
  run_test_tcp_bind_localhost_ok_cold_4();
  puStack_468 = (uv_loop_t *)0x1c35e9;
  puStack_360 = unaff_RBX;
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&sStack_448);
  uStack_438.data = (void *)(long)iVar1;
  lStack_458 = 0;
  if (uStack_438.data == (void *)0x0) {
    puStack_468 = (uv_loop_t *)0x1c360e;
    puVar2 = uv_default_loop();
    puStack_468 = (uv_loop_t *)0x1c361b;
    iVar1 = uv_tcp_init(puVar2,&uStack_438);
    lStack_458 = (long)iVar1;
    lStack_450 = 0;
    if (lStack_458 != 0) goto LAB_001c36d6;
    puStack_468 = (uv_loop_t *)0x1c364f;
    iVar1 = uv_tcp_bind(&uStack_438,(sockaddr *)&sStack_448,1);
    lStack_458 = (long)iVar1;
    lStack_450 = -0x16;
    if (lStack_458 != -0x16) goto LAB_001c36e5;
    puStack_468 = (uv_loop_t *)0x1c3670;
    unaff_RBX = uv_default_loop();
    puStack_468 = (uv_loop_t *)0x1c3684;
    uv_walk(unaff_RBX,close_walk_cb,(void *)0x0);
    puStack_468 = (uv_loop_t *)0x1c368e;
    uv_run(unaff_RBX,UV_RUN_DEFAULT);
    lStack_458 = 0;
    puStack_468 = (uv_loop_t *)0x1c369c;
    puVar2 = uv_default_loop();
    puStack_468 = (uv_loop_t *)0x1c36a4;
    iVar1 = uv_loop_close(puVar2);
    lStack_450 = (long)iVar1;
    if (lStack_458 == lStack_450) {
      puStack_468 = (uv_loop_t *)0x1c36bc;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    puStack_468 = (uv_loop_t *)0x1c36d6;
    run_test_tcp_bind_invalid_flags_cold_1();
LAB_001c36d6:
    puStack_468 = (uv_loop_t *)0x1c36e5;
    run_test_tcp_bind_invalid_flags_cold_2();
LAB_001c36e5:
    puStack_468 = (uv_loop_t *)0x1c36f4;
    run_test_tcp_bind_invalid_flags_cold_3();
  }
  puStack_468 = (uv_loop_t *)run_test_tcp_listen_without_bind;
  run_test_tcp_bind_invalid_flags_cold_4();
  puStack_560 = (uv_loop_t *)0x1c3710;
  puStack_468 = unaff_RBX;
  puVar2 = uv_default_loop();
  puStack_560 = (uv_loop_t *)0x1c371d;
  iVar1 = uv_tcp_init(puVar2,&uStack_540);
  lStack_548 = (long)iVar1;
  lStack_550 = 0;
  if (lStack_548 == 0) {
    puStack_560 = (uv_loop_t *)0x1c374e;
    iVar1 = uv_listen((uv_stream_t *)&uStack_540,0x80,(uv_connection_cb)0x0);
    lStack_548 = (long)iVar1;
    lStack_550 = 0;
    if (lStack_548 != 0) goto LAB_001c37d5;
    puStack_560 = (uv_loop_t *)0x1c376f;
    unaff_RBX = uv_default_loop();
    puStack_560 = (uv_loop_t *)0x1c3783;
    uv_walk(unaff_RBX,close_walk_cb,(void *)0x0);
    puStack_560 = (uv_loop_t *)0x1c378d;
    uv_run(unaff_RBX,UV_RUN_DEFAULT);
    lStack_548 = 0;
    puStack_560 = (uv_loop_t *)0x1c379b;
    puVar2 = uv_default_loop();
    puStack_560 = (uv_loop_t *)0x1c37a3;
    iVar1 = uv_loop_close(puVar2);
    lStack_550 = (long)iVar1;
    if (lStack_548 == lStack_550) {
      puStack_560 = (uv_loop_t *)0x1c37bb;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    puStack_560 = (uv_loop_t *)0x1c37d5;
    run_test_tcp_listen_without_bind_cold_1();
LAB_001c37d5:
    puStack_560 = (uv_loop_t *)0x1c37e4;
    run_test_tcp_listen_without_bind_cold_2();
  }
  puStack_560 = (uv_loop_t *)run_test_tcp_bind_writable_flags;
  run_test_tcp_listen_without_bind_cold_3();
  puStack_798 = (uv_loop_t *)0x1c3811;
  puStack_560 = unaff_RBX;
  iVar1 = uv_ip4_addr("0.0.0.0",0x23a3,&sStack_720);
  uStack_638.data = (void *)(long)iVar1;
  uStack_710.data = (void *)0x0;
  if (uStack_638.data == (void *)0x0) {
    puStack_798 = (uv_loop_t *)0x1c3842;
    puVar2 = uv_default_loop();
    puStack_798 = (uv_loop_t *)0x1c3852;
    iVar1 = uv_tcp_init(puVar2,&uStack_638);
    uStack_710.data = (void *)(long)iVar1;
    uStack_778.data = (void *)0x0;
    if (uStack_710.data != (void *)0x0) goto LAB_001c3ada;
    puStack_798 = (uv_loop_t *)0x1c388c;
    iVar1 = uv_tcp_bind(&uStack_638,(sockaddr *)&sStack_720,0);
    uStack_710.data = (void *)(long)iVar1;
    uStack_778.data = (void *)0x0;
    if (uStack_710.data != (void *)0x0) goto LAB_001c3aec;
    puStack_798 = (uv_loop_t *)0x1c38c6;
    iVar1 = uv_listen((uv_stream_t *)&uStack_638,0x80,(uv_connection_cb)0x0);
    uStack_710.data = (void *)(long)iVar1;
    uStack_778.data = (void *)0x0;
    if (uStack_710.data != (void *)0x0) goto LAB_001c3afe;
    puStack_798 = (uv_loop_t *)0x1c38f9;
    iVar1 = uv_is_writable((uv_stream_t *)&uStack_638);
    uStack_710.data = (void *)(long)iVar1;
    uStack_778.data = (void *)0x0;
    if (uStack_710.data != (void *)0x0) goto LAB_001c3b10;
    puStack_798 = (uv_loop_t *)0x1c392c;
    iVar1 = uv_is_readable((uv_stream_t *)&uStack_638);
    uStack_710.data = (void *)(long)iVar1;
    uStack_778.data = (void *)0x0;
    if (uStack_710.data != (void *)0x0) goto LAB_001c3b22;
    puStack_798 = (uv_loop_t *)0x1c3963;
    uStack_648 = uv_buf_init("PING",4);
    puStack_798 = (uv_loop_t *)0x1c3992;
    iVar1 = uv_write(&uStack_710,(uv_stream_t *)&uStack_638,&uStack_648,1,(uv_write_cb)0x0);
    uStack_778.data = (void *)(long)iVar1;
    lStack_788 = -0x20;
    if (uStack_778.data != (void *)0xffffffffffffffe0) goto LAB_001c3b34;
    puStack_798 = (uv_loop_t *)0x1c39c6;
    iVar1 = uv_shutdown(&uStack_778,(uv_stream_t *)&uStack_638,(uv_shutdown_cb)0x0);
    lStack_788 = (long)iVar1;
    lStack_780 = -0x6b;
    if (lStack_788 != -0x6b) goto LAB_001c3b43;
    puStack_798 = (uv_loop_t *)0x1c39fd;
    iVar1 = uv_read_start((uv_stream_t *)&uStack_638,abort,abort);
    lStack_788 = (long)iVar1;
    lStack_780 = -0x6b;
    if (lStack_788 != -0x6b) goto LAB_001c3b52;
    puStack_798 = (uv_loop_t *)0x1c3a31;
    uv_close((uv_handle_t *)&uStack_638,close_cb);
    puStack_798 = (uv_loop_t *)0x1c3a36;
    puVar2 = uv_default_loop();
    puStack_798 = (uv_loop_t *)0x1c3a40;
    uv_run(puVar2,UV_RUN_DEFAULT);
    lStack_788 = 1;
    lStack_780 = (long)close_cb_called;
    if (lStack_780 != 1) goto LAB_001c3b61;
    puStack_798 = (uv_loop_t *)0x1c3a6a;
    unaff_RBX = uv_default_loop();
    puStack_798 = (uv_loop_t *)0x1c3a7e;
    uv_walk(unaff_RBX,close_walk_cb,(void *)0x0);
    puStack_798 = (uv_loop_t *)0x1c3a88;
    uv_run(unaff_RBX,UV_RUN_DEFAULT);
    lStack_788 = 0;
    puStack_798 = (uv_loop_t *)0x1c3a96;
    puVar2 = uv_default_loop();
    puStack_798 = (uv_loop_t *)0x1c3a9e;
    iVar1 = uv_loop_close(puVar2);
    lStack_780 = (long)iVar1;
    if (lStack_788 == lStack_780) {
      puStack_798 = (uv_loop_t *)0x1c3aba;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    puStack_798 = (uv_loop_t *)0x1c3ada;
    run_test_tcp_bind_writable_flags_cold_1();
LAB_001c3ada:
    puStack_798 = (uv_loop_t *)0x1c3aec;
    run_test_tcp_bind_writable_flags_cold_2();
LAB_001c3aec:
    puStack_798 = (uv_loop_t *)0x1c3afe;
    run_test_tcp_bind_writable_flags_cold_3();
LAB_001c3afe:
    puStack_798 = (uv_loop_t *)0x1c3b10;
    run_test_tcp_bind_writable_flags_cold_4();
LAB_001c3b10:
    puStack_798 = (uv_loop_t *)0x1c3b22;
    run_test_tcp_bind_writable_flags_cold_5();
LAB_001c3b22:
    puStack_798 = (uv_loop_t *)0x1c3b34;
    run_test_tcp_bind_writable_flags_cold_6();
LAB_001c3b34:
    puStack_798 = (uv_loop_t *)0x1c3b43;
    run_test_tcp_bind_writable_flags_cold_7();
LAB_001c3b43:
    puStack_798 = (uv_loop_t *)0x1c3b52;
    run_test_tcp_bind_writable_flags_cold_8();
LAB_001c3b52:
    puStack_798 = (uv_loop_t *)0x1c3b61;
    run_test_tcp_bind_writable_flags_cold_9();
LAB_001c3b61:
    puStack_798 = (uv_loop_t *)0x1c3b70;
    run_test_tcp_bind_writable_flags_cold_10();
  }
  puStack_798 = (uv_loop_t *)run_test_tcp_bind_or_listen_error_after_close;
  run_test_tcp_bind_writable_flags_cold_11();
  uStack_87c = 0;
  uStack_874 = 0;
  auStack_888._8_4_ = 0xf270002;
  puStack_798 = unaff_RBX;
  puVar2 = uv_default_loop();
  iVar1 = uv_tcp_init(puVar2,&uStack_870);
  auStack_888._0_8_ = SEXT48(iVar1);
  if ((void *)auStack_888._0_8_ == (void *)0x0) {
    uv_close((uv_handle_t *)&uStack_870,(uv_close_cb)0x0);
    iVar1 = uv_tcp_bind(&uStack_870,(sockaddr *)(auStack_888 + 8),0);
    auStack_888._0_8_ = SEXT48(iVar1);
    if ((void *)auStack_888._0_8_ != (void *)0xffffffffffffffea) goto LAB_001c3cd5;
    iVar1 = uv_listen((uv_stream_t *)&uStack_870,5,(uv_connection_cb)0x0);
    auStack_888._0_8_ = SEXT48(iVar1);
    if ((void *)auStack_888._0_8_ != (void *)0xffffffffffffffea) goto LAB_001c3ce4;
    puVar2 = uv_default_loop();
    iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
    auStack_888._0_8_ = SEXT48(iVar1);
    if ((void *)auStack_888._0_8_ == (void *)0x0) {
      puVar2 = uv_default_loop();
      uv_walk(puVar2,close_walk_cb,(void *)0x0);
      uv_run(puVar2,UV_RUN_DEFAULT);
      auStack_888._0_8_ = (void *)0x0;
      puVar2 = uv_default_loop();
      iVar1 = uv_loop_close(puVar2);
      if ((void *)auStack_888._0_8_ == (void *)(long)iVar1) {
        uv_library_shutdown();
        return 0;
      }
      goto LAB_001c3d02;
    }
  }
  else {
    run_test_tcp_bind_or_listen_error_after_close_cold_1();
LAB_001c3cd5:
    run_test_tcp_bind_or_listen_error_after_close_cold_2();
LAB_001c3ce4:
    run_test_tcp_bind_or_listen_error_after_close_cold_3();
  }
  run_test_tcp_bind_or_listen_error_after_close_cold_4();
LAB_001c3d02:
  handle = (uv_handle_t *)auStack_888;
  run_test_tcp_bind_or_listen_error_after_close_cold_5();
  iVar1 = uv_is_closing(handle);
  if (iVar1 != 0) {
    return iVar1;
  }
  uv_close(handle,(uv_close_cb)0x0);
  return extraout_EAX;
}

Assistant:

TEST_IMPL(tcp_bind_error_fault) {
  char garbage[] =
      "blah blah blah blah blah blah blah blah blah blah blah blah";
  struct sockaddr_in* garbage_addr;
  uv_tcp_t server;
  int r;

  garbage_addr = (struct sockaddr_in*) &garbage;

  r = uv_tcp_init(uv_default_loop(), &server);
  ASSERT_OK(r);
  r = uv_tcp_bind(&server, (const struct sockaddr*) garbage_addr, 0);
  ASSERT_EQ(r, UV_EINVAL);

  uv_close((uv_handle_t*)&server, close_cb);

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT_EQ(1, close_cb_called);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}